

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O2

void __thiscall
slang::ast::
ASTVisitor<always_ff_assignment_outside_conditional::AlwaysFFVisitor,_true,_true,_false,_false>::
visit<slang::ast::ConditionBinsSelectExpr>
          (ASTVisitor<always_ff_assignment_outside_conditional::AlwaysFFVisitor,_true,_true,_false,_false>
           *this,ConditionBinsSelectExpr *t)

{
  if ((t->super_BinsSelectExpr).kind != Invalid) {
    ConditionBinsSelectExpr::visitExprs<always_ff_assignment_outside_conditional::AlwaysFFVisitor&>
              (t,(AlwaysFFVisitor *)this);
    return;
  }
  return;
}

Assistant:

bool bad() const { return kind == BinsSelectExprKind::Invalid; }